

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void gen_laguerre_ss_root
               (double *x,int order,double alpha,double *dp2,double *p1,double *b,double *c)

{
  int local_5c;
  int step_max;
  int step;
  double p2;
  double eps;
  double d;
  double *c_local;
  double *b_local;
  double *p1_local;
  double *dp2_local;
  double alpha_local;
  double *pdStack_10;
  int order_local;
  double *x_local;
  
  d = (double)c;
  c_local = b;
  b_local = p1;
  p1_local = dp2;
  dp2_local = (double *)alpha;
  alpha_local._4_4_ = order;
  pdStack_10 = x;
  p2 = r8_epsilon();
  local_5c = 1;
  while( true ) {
    if (10 < local_5c) {
      return;
    }
    gen_laguerre_ss_recur
              ((double *)&step_max,p1_local,b_local,*pdStack_10,alpha_local._4_4_,(double)dp2_local,
               c_local,(double *)d);
    eps = _step_max / *p1_local;
    *pdStack_10 = *pdStack_10 - eps;
    if (ABS(eps) <= p2 * (ABS(*pdStack_10) + 1.0)) break;
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

void gen_laguerre_ss_root ( double *x, int order, double alpha, double *dp2, 
  double *p1, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_LAGUERRE_SS_ROOT improves a root of a generalized Laguerre polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input/output, double *X, the approximate root, which
//    should be improved on output.
//
//    Input, int ORDER, the order of the polynomial to be computed.
//
//    Input, double ALPHA, the exponent of the X factor.
//
//    Output, double *DP2, the value of L'(ORDER)(X).
//
//    Output, double *P1, the value of L(ORDER-1)(X).
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double d;
  double eps;
  double p2;
  int step;
  int step_max = 10;

  eps = r8_epsilon ( );

  for ( step = 1; step <= step_max; step++ )
  {
    gen_laguerre_ss_recur ( &p2, dp2, p1, *x, order, alpha, b, c );

    d = p2 / ( *dp2 );
    *x = *x - d;

    if ( fabs ( d ) <= eps * ( fabs ( *x ) + 1.0 ) )
    {
      break;
    }
  }

  return;
}